

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse_new.hpp
# Opt level: O3

const_reference_value __thiscall
Disa::Matrix_Sparse_Row::SparseAccessor::operator_cast_to_double_(SparseAccessor *this)

{
  long lVar1;
  __normal_iterator<int_*,_std::span<int,_18446744073709551615UL>_> _Var2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  source_location *location;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  size_type *local_e8;
  size_type local_e0;
  size_type local_d8;
  undefined8 uStack_d0;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lVar1 = *(long *)(*(long *)this + 0x10);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<int*,std::span<int,18446744073709551615ul>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    (lVar1,lVar1 + *(long *)(*(long *)this + 0x18) * 4,this + 8);
  location = *(source_location **)this;
  if (_Var2._M_current !=
      (int *)((long)&(location[2]._M_impl)->_M_file_name + (long)location[3]._M_impl * 4)) {
    return (const_reference_value)
           (((long)_Var2._M_current - (long)location[2]._M_impl) * 2 + (long)location[4]._M_impl);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  local_48 = &PTR_s__workspace_llm4binary_github_lic_00161610;
  console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,location);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__cxx11::to_string
            (&local_a8,
             (int)((ulong)((*(undefined8 **)this)[1] - *(long *)**(undefined8 **)this) >> 2));
  std::operator+(&local_88,"Attempting to implicitly insert an new element at (",&local_a8);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_88,", ");
  local_108._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p == paVar5) {
    local_108.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_108.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  }
  else {
    local_108.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_108._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string(&local_c8,*(int *)(this + 8));
  std::operator+(&local_68,&local_108,&local_c8);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_68,") must use explicit assignment operator.");
  local_e8 = (size_type *)(pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8 == paVar5) {
    local_d8 = paVar5->_M_allocated_capacity;
    uStack_d0 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_e8 = &local_d8;
  }
  else {
    local_d8 = paVar5->_M_allocated_capacity;
  }
  local_e0 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_e8,local_e0);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_40);
  exit(1);
}

Assistant:

[[nodiscard]] operator const_reference_value() const {
      auto iter = std::find(row_.i_column.begin(), row_.i_column.end(), i_column);
      ASSERT_DEBUG(iter != row_.i_column.end(), "Attempting to implicitly insert an new element at (" +
                                                std::to_string(row_.row()) + ", " + std::to_string(i_column) +
                                                ") must use explicit assignment operator.");
      return *(row_.value.begin() + std::distance(row_.i_column.begin(), iter));
    }